

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O2

BoundLimitNode *
duckdb::BoundLimitNode::ExpressionValue
          (BoundLimitNode *__return_storage_ptr__,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> local_10;
  
  local_10._M_head_impl =
       (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundLimitNode(__return_storage_ptr__,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_10,false);
  if (local_10._M_head_impl != (Expression *)0x0) {
    (*((local_10._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundLimitNode BoundLimitNode::ExpressionValue(unique_ptr<Expression> expression) {
	return BoundLimitNode(std::move(expression), false);
}